

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall deqp::gls::VertexArrayTest::compare(VertexArrayTest *this)

{
  RGBA RVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RGBA RVar6;
  uint uVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  byte local_99b;
  byte local_99a;
  byte local_992;
  byte local_98a;
  byte local_972;
  byte local_96a;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  LogImage local_8a8;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  LogImageSet local_7c8;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  LogImage local_738;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  LogImage local_658;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  LogImage local_578;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  LogImageSet local_498;
  MessageBuilder local_458;
  TestLog *local_2d8;
  TestLog *log;
  RGBA local_2c8;
  RGBA local_2c4;
  RGBA local_2c0;
  RGBA local_2bc;
  undefined1 local_2b7;
  byte local_2b6;
  byte local_2b5;
  RGBA local_2b4;
  deUint8 b_1;
  deUint8 g_1;
  deUint8 r_1;
  RGBA refCmpPixel;
  deUint8 b;
  deUint8 g;
  int iStack_2a8;
  deUint8 r;
  RGBA screenCmpPixel;
  int dx;
  int dy;
  bool screenThin;
  RGBA local_238;
  bool refThin;
  RGBA local_230;
  RGBA RStack_22c;
  bool isOkPixel;
  RGBA screenPixel;
  RGBA refPixel;
  int x;
  int y;
  Surface error;
  RGBA threshold;
  ConstPixelBufferAccess local_1d8;
  MessageBuilder local_1a0;
  Surface *local_20;
  Surface *screen;
  Surface *ref;
  VertexArrayTest *this_local;
  
  ref = (Surface *)this;
  screen = ContextArrayPack::getSurface(this->m_rrArrayPack);
  local_20 = ContextArrayPack::getSurface(this->m_glArrayPack);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var,iVar3));
  if (iVar3 < 2) {
    tcu::RGBA::RGBA((RGBA *)((long)&error.m_pixels.m_cap + 4),this->m_maxDiffRed,
                    this->m_maxDiffGreen,this->m_maxDiffBlue,0xff);
    iVar3 = tcu::Surface::getWidth(screen);
    iVar4 = tcu::Surface::getHeight(screen);
    tcu::Surface::Surface((Surface *)&x,iVar3,iVar4);
    this->m_isOk = true;
    for (refPixel.m_value = 0; iVar3 = tcu::Surface::getHeight(screen),
        (int)refPixel.m_value < iVar3; refPixel.m_value = refPixel.m_value + 1) {
      for (screenPixel.m_value = 0; RVar1.m_value = screenPixel.m_value,
          iVar3 = tcu::Surface::getWidth(screen), (int)RVar1.m_value < iVar3;
          screenPixel.m_value = screenPixel.m_value + 1) {
        RStack_22c = tcu::Surface::getPixel(screen,screenPixel.m_value,refPixel.m_value);
        local_230 = tcu::Surface::getPixel(local_20,screenPixel.m_value,refPixel.m_value);
        refThin = false;
        if ((((refPixel.m_value == 0) ||
             (iVar3 = tcu::Surface::getHeight(screen), refPixel.m_value + 1 == iVar3)) ||
            (screenPixel.m_value == 0)) ||
           (iVar3 = screenPixel.m_value + 1, iVar4 = tcu::Surface::getWidth(screen),
           RVar1.m_value = RStack_22c.m_value, iVar3 == iVar4)) {
          RVar1.m_value = screenPixel.m_value;
          iVar3 = tcu::RGBA::getRed(&local_230);
          iVar4 = tcu::RGBA::getGreen(&local_230);
          iVar5 = tcu::RGBA::getBlue(&local_230);
          tcu::RGBA::RGBA(&local_238,iVar3,(iVar4 + 0xff) - (iVar4 + 0xff >> 0x1f) >> 1,iVar5,0xff);
          tcu::Surface::setPixel((Surface *)&x,RVar1.m_value,refPixel.m_value,local_238);
        }
        else {
          RVar6 = tcu::Surface::getPixel(screen,screenPixel.m_value - 1,refPixel.m_value);
          bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
          RVar1.m_value = RStack_22c.m_value;
          if (bVar2) {
LAB_026be470:
            RVar1.m_value = RStack_22c.m_value;
            RVar6 = tcu::Surface::getPixel(screen,screenPixel.m_value,refPixel.m_value - 1);
            bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
            RVar1.m_value = RStack_22c.m_value;
            local_972 = 0;
            if (!bVar2) {
              RVar6 = tcu::Surface::getPixel(screen,screenPixel.m_value,refPixel.m_value + 1);
              bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
              local_972 = bVar2 ^ 0xff;
            }
            local_96a = local_972;
          }
          else {
            RVar6 = tcu::Surface::getPixel(screen,screenPixel.m_value + 1,refPixel.m_value);
            bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
            local_96a = 1;
            if (bVar2) goto LAB_026be470;
          }
          RVar1.m_value = local_230.m_value;
          RVar6 = tcu::Surface::getPixel(local_20,screenPixel.m_value - 1,refPixel.m_value);
          bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
          RVar1.m_value = local_230.m_value;
          if (bVar2) {
LAB_026be659:
            RVar1.m_value = local_230.m_value;
            RVar6 = tcu::Surface::getPixel(local_20,screenPixel.m_value,refPixel.m_value - 1);
            bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
            RVar1.m_value = local_230.m_value;
            local_992 = 0;
            if (!bVar2) {
              RVar6 = tcu::Surface::getPixel(local_20,screenPixel.m_value,refPixel.m_value + 1);
              bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
              local_992 = bVar2 ^ 0xff;
            }
            local_98a = local_992;
          }
          else {
            RVar6 = tcu::Surface::getPixel(local_20,screenPixel.m_value + 1,refPixel.m_value);
            bVar2 = tcu::compareThreshold(RVar1,RVar6,error.m_pixels.m_cap._4_4_);
            local_98a = 1;
            if (bVar2) goto LAB_026be659;
          }
          if (((local_96a & 1) == 0) || ((local_98a & 1) == 0)) {
            screenCmpPixel.m_value = 0xffffffff;
            while( true ) {
              local_99a = 0;
              if ((int)screenCmpPixel.m_value < 2) {
                local_99a = refThin ^ 0xff;
              }
              if ((local_99a & 1) == 0) break;
              iStack_2a8 = -1;
              while( true ) {
                local_99b = 0;
                if (iStack_2a8 < 2) {
                  local_99b = refThin ^ 0xff;
                }
                if ((local_99b & 1) == 0) break;
                refCmpPixel = tcu::Surface::getPixel
                                        (local_20,screenPixel.m_value + iStack_2a8,
                                         refPixel.m_value + screenCmpPixel.m_value);
                iVar3 = tcu::RGBA::getRed(&stack0xfffffffffffffdd4);
                iVar4 = tcu::RGBA::getRed(&refCmpPixel);
                iVar3 = deAbs32(iVar3 - iVar4);
                r_1 = (deUint8)iVar3;
                iVar3 = tcu::RGBA::getGreen(&stack0xfffffffffffffdd4);
                iVar4 = tcu::RGBA::getGreen(&refCmpPixel);
                iVar3 = deAbs32(iVar3 - iVar4);
                g_1 = (deUint8)iVar3;
                iVar3 = tcu::RGBA::getBlue(&stack0xfffffffffffffdd4);
                iVar4 = tcu::RGBA::getBlue(&refCmpPixel);
                uVar7 = deAbs32(iVar3 - iVar4);
                b_1 = (deUint8)uVar7;
                if ((((int)(uint)r_1 <= this->m_maxDiffRed) &&
                    ((int)(uint)g_1 <= this->m_maxDiffGreen)) &&
                   ((int)(uVar7 & 0xff) <= this->m_maxDiffBlue)) {
                  refThin = true;
                }
                local_2b4 = tcu::Surface::getPixel
                                      (screen,screenPixel.m_value + iStack_2a8,
                                       refPixel.m_value + screenCmpPixel.m_value);
                iVar3 = tcu::RGBA::getRed(&local_2b4);
                iVar4 = tcu::RGBA::getRed(&local_230);
                iVar3 = deAbs32(iVar3 - iVar4);
                local_2b5 = (byte)iVar3;
                iVar3 = tcu::RGBA::getGreen(&local_2b4);
                iVar4 = tcu::RGBA::getGreen(&local_230);
                iVar3 = deAbs32(iVar3 - iVar4);
                local_2b6 = (byte)iVar3;
                iVar3 = tcu::RGBA::getBlue(&local_2b4);
                iVar4 = tcu::RGBA::getBlue(&local_230);
                uVar7 = deAbs32(iVar3 - iVar4);
                local_2b7 = (undefined1)uVar7;
                if ((((int)(uint)local_2b5 <= this->m_maxDiffRed) &&
                    ((int)(uint)local_2b6 <= this->m_maxDiffGreen)) &&
                   ((int)(uVar7 & 0xff) <= this->m_maxDiffBlue)) {
                  refThin = true;
                }
                iStack_2a8 = iStack_2a8 + 1;
              }
              screenCmpPixel.m_value = screenCmpPixel.m_value + 1;
            }
          }
          else {
            refThin = true;
          }
          RVar1.m_value = screenPixel.m_value;
          if ((refThin & 1U) == 0) {
            tcu::RGBA::RGBA((RGBA *)((long)&log + 4),0xff,0,0,0xff);
            tcu::Surface::setPixel((Surface *)&x,RVar1.m_value,refPixel.m_value,log._4_4_);
            this->m_isOk = false;
          }
          else {
            local_2c0 = tcu::Surface::getPixel(local_20,screenPixel.m_value,refPixel.m_value);
            iVar3 = tcu::RGBA::getRed(&local_2c0);
            local_2c4 = tcu::Surface::getPixel(local_20,screenPixel.m_value,refPixel.m_value);
            iVar4 = tcu::RGBA::getGreen(&local_2c4);
            local_2c8 = tcu::Surface::getPixel(local_20,screenPixel.m_value,refPixel.m_value);
            iVar5 = tcu::RGBA::getBlue(&local_2c8);
            tcu::RGBA::RGBA(&local_2bc,iVar3,(iVar4 + 0xff) - (iVar4 + 0xff >> 0x1f) >> 1,iVar5,0xff
                           );
            tcu::Surface::setPixel((Surface *)&x,RVar1.m_value,refPixel.m_value,local_2bc);
          }
        }
      }
    }
    pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    local_2d8 = pTVar8;
    if ((this->m_isOk & 1U) == 0) {
      tcu::TestLog::operator<<(&local_458,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_458,(char (*) [39])"Image comparison failed, threshold = (");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_maxDiffRed);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_maxDiffGreen);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2a4b1eb);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_maxDiffBlue);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_458);
      pTVar8 = local_2d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,"Compare result",&local_4b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,"Result of rendering",&local_4e1);
      tcu::LogImageSet::LogImageSet(&local_498,&local_4b8,&local_4e0);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_498);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"Result",&local_599);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"Result",&local_5c1);
      tcu::LogImage::LogImage
                (&local_578,&local_598,&local_5c0,local_20,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_578);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"Reference",&local_679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"Reference",&local_6a1);
      tcu::LogImage::LogImage
                (&local_658,&local_678,&local_6a0,screen,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_658);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"ErrorMask",&local_759);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_780,"Error mask",&local_781);
      tcu::LogImage::LogImage
                (&local_738,&local_758,&local_780,(Surface *)&x,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_738);
      tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_738);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      std::__cxx11::string::~string((string *)&local_758);
      std::allocator<char>::~allocator(&local_759);
      tcu::LogImage::~LogImage(&local_658);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator(&local_679);
      tcu::LogImage::~LogImage(&local_578);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator(&local_5c1);
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator(&local_599);
      tcu::LogImageSet::~LogImageSet(&local_498);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator(&local_4b9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e8,"Compare result",&local_7e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_810,"Result of rendering",&local_811);
      tcu::LogImageSet::LogImageSet(&local_7c8,&local_7e8,&local_810);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_7c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"Result",&local_8c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"Result",&local_8f1);
      tcu::LogImage::LogImage
                (&local_8a8,&local_8c8,&local_8f0,local_20,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_8a8);
      tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_8a8);
      std::__cxx11::string::~string((string *)&local_8f0);
      std::allocator<char>::~allocator(&local_8f1);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::allocator<char>::~allocator(&local_8c9);
      tcu::LogImageSet::~LogImageSet(&local_7c8);
      std::__cxx11::string::~string((string *)&local_810);
      std::allocator<char>::~allocator(&local_811);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::allocator<char>::~allocator(&local_7e9);
    }
    tcu::Surface::~Surface((Surface *)&x);
  }
  else {
    pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_1a0,
                        (char (*) [139])
                        "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
                       );
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::Surface::getAccess(&local_1d8,screen);
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&stack0xfffffffffffffe00,local_20);
    bVar2 = tcu::fuzzyCompare(pTVar8,"Compare Results","Compare Results",&local_1d8,
                              (ConstPixelBufferAccess *)&stack0xfffffffffffffe00,1.5,
                              COMPARE_LOG_RESULT);
    this->m_isOk = bVar2;
  }
  return;
}

Assistant:

void VertexArrayTest::compare (void)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		m_isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 1.5f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		tcu::RGBA		threshold	(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 255);
		tcu::Surface	error		(ref.getWidth(), ref.getHeight());

		m_isOk = true;

		for (int y = 0; y < ref.getHeight(); y++)
		{
			for (int x = 0; x < ref.getWidth(); x++)
			{
				tcu::RGBA	refPixel		= ref.getPixel(x, y);
				tcu::RGBA	screenPixel		= screen.getPixel(x, y);
				bool		isOkPixel		= false;

				if (y == 0 || y + 1 == ref.getHeight() || x == 0 || x + 1 == ref.getWidth())
				{
					// Don't check borders since the pixel neighborhood is undefined
					error.setPixel(x, y, tcu::RGBA(screenPixel.getRed(), (screenPixel.getGreen() + 255) / 2, screenPixel.getBlue(), 255));
					continue;
				}

				// Don't do comparisons for this pixel if it belongs to a one-pixel-thin part (i.e. it doesn't have similar-color neighbors in both x and y directions) in both result and reference.
				// This fixes some false negatives.
				bool		refThin			= (!tcu::compareThreshold(refPixel, ref.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(refPixel, ref.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x  , y+1), threshold));
				bool		screenThin		= (!tcu::compareThreshold(screenPixel, screen.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(screenPixel, screen.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x  , y+1), threshold));

				if (refThin && screenThin)
					isOkPixel = true;
				else
				{
					for (int dy = -1; dy < 2 && !isOkPixel; dy++)
					{
						for (int dx = -1; dx < 2 && !isOkPixel; dx++)
						{
							// Check reference pixel against screen pixel
							{
								tcu::RGBA	screenCmpPixel	= screen.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refPixel.getRed()	- screenCmpPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refPixel.getGreen()	- screenCmpPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refPixel.getBlue()	- screenCmpPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}

							// Check screen pixels against reference pixel
							{
								tcu::RGBA	refCmpPixel		= ref.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refCmpPixel.getRed()		- screenPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refCmpPixel.getGreen()	- screenPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refCmpPixel.getBlue()	- screenPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}
						}
					}
				}

				if (isOkPixel)
					error.setPixel(x, y, tcu::RGBA(screen.getPixel(x, y).getRed(), (screen.getPixel(x, y).getGreen() + 255) / 2, screen.getPixel(x, y).getBlue(), 255));
				else
				{
					error.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					m_isOk = false;
				}
			}
		}

		tcu::TestLog& log = m_testCtx.getLog();
		if (!m_isOk)
		{
			log << TestLog::Message << "Image comparison failed, threshold = (" << m_maxDiffRed << ", " << m_maxDiffGreen << ", " << m_maxDiffBlue << ")" << TestLog::EndMessage;
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result",		"Result",		screen)
				<< TestLog::Image("Reference",	"Reference",	ref)
				<< TestLog::Image("ErrorMask",	"Error mask",	error)
				<< TestLog::EndImageSet;
		}
		else
		{
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result", "Result", screen)
				<< TestLog::EndImageSet;
		}
	}
}